

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMeshControl.cpp
# Opt level: O1

void __thiscall
TPZMHMeshControl::ConnectedInterfaceElements
          (TPZMHMeshControl *this,int64_t skeleton,pair<long,_long> *leftright,
          map<long,_std::__cxx11::list<TPZInterfaceElement_*,_std::allocator<TPZInterfaceElement_*>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::list<TPZInterfaceElement_*,_std::allocator<TPZInterfaceElement_*>_>_>_>_>
          *intfaces)

{
  size_t *psVar1;
  _Rb_tree_header *p_Var2;
  bool bVar3;
  _List_node_base *p_Var4;
  mapped_type *pmVar5;
  _List_node_base *p_Var6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  int iVar9;
  TPZGeoElSide neighbour;
  _Self __tmp;
  TPZCompElSide celside;
  TPZGeoElSide gelside;
  TPZCompElSide celneigh;
  map<long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>_>
  ellist;
  TPZGeoElSide local_f0;
  _Rb_tree_node_base *local_d8;
  _func_int **local_d0;
  TPZCompElSide local_c8;
  TPZGeoElSide local_b8;
  _Base_ptr local_a0;
  map<long,_std::__cxx11::list<TPZInterfaceElement_*,_std::allocator<TPZInterfaceElement_*>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::list<TPZInterfaceElement_*,_std::allocator<TPZInterfaceElement_*>_>_>_>_>
  *local_98;
  _Rb_tree_node_base *local_90;
  _func_int **local_88;
  TPZGeoEl *local_80;
  int local_78;
  long local_70;
  _Rb_tree<long,_std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>,_std::_Select1st<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>_>
  local_60;
  
  p_Var2 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_98 = intfaces;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  ConnectedElements(this,skeleton,leftright,
                    (map<long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>_>
                     *)&local_60);
  if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left != p_Var2) {
    local_d0 = (_func_int **)&PTR__TPZGeoElSide_01920090;
    p_Var7 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      local_a0 = (_Base_ptr)&p_Var7[1]._M_parent;
      p_Var8 = p_Var7[1]._M_parent;
      local_d8 = p_Var7;
      if (p_Var8 != local_a0) {
        local_90 = p_Var7 + 1;
        do {
          local_c8.fEl = (TPZCompEl *)p_Var8->_M_left;
          local_c8.fSide = *(int *)&p_Var8->_M_right;
          TPZCompElSide::Reference(&local_b8,&local_c8);
          if (local_b8.fGeoEl == (TPZGeoEl *)0x0) {
            local_f0.super_TPZSavable._vptr_TPZSavable = local_d0;
            local_f0.fGeoEl = (TPZGeoEl *)0x0;
            local_f0.fSide = -1;
          }
          else {
            (**(code **)(*(long *)local_b8.fGeoEl + 0x188))
                      (&local_f0,local_b8.fGeoEl,local_b8.fSide);
          }
          do {
            if ((local_f0.fGeoEl == local_b8.fGeoEl) && (local_f0.fSide == local_b8.fSide)) break;
            TPZGeoElSide::Reference(&local_f0);
            if (local_70 == 0) {
LAB_013bf07d:
              if (local_f0.fGeoEl == (TPZGeoEl *)0x0) {
                local_88 = local_d0;
                local_80 = (TPZGeoEl *)0x0;
                local_78 = -1;
              }
              else {
                (**(code **)(*(long *)local_f0.fGeoEl + 0x188))
                          (&local_88,local_f0.fGeoEl,local_f0.fSide);
              }
              local_f0.fSide = local_78;
              local_f0.fGeoEl = local_80;
              iVar9 = 0;
            }
            else {
              iVar9 = 0;
              p_Var4 = (_List_node_base *)
                       __dynamic_cast(local_70,&TPZCompEl::typeinfo,&TPZInterfaceElement::typeinfo,0
                                     );
              bVar3 = true;
              if (p_Var4 != (_List_node_base *)0x0) {
                if (((local_c8.fEl == (TPZCompEl *)p_Var4[2]._M_prev) &&
                    (local_c8.fSide == *(int *)&p_Var4[3]._M_next)) ||
                   ((local_c8.fEl == (TPZCompEl *)p_Var4[3]._M_prev &&
                    (local_c8.fSide == *(int *)&p_Var4[4]._M_next)))) {
                  pmVar5 = std::
                           map<long,_std::__cxx11::list<TPZInterfaceElement_*,_std::allocator<TPZInterfaceElement_*>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::list<TPZInterfaceElement_*,_std::allocator<TPZInterfaceElement_*>_>_>_>_>
                           ::operator[](local_98,(key_type_conflict1 *)local_90);
                  p_Var6 = (_List_node_base *)operator_new(0x18);
                  p_Var6[1]._M_next = p_Var4;
                  std::__detail::_List_node_base::_M_hook(p_Var6);
                  psVar1 = &(pmVar5->
                            super__List_base<TPZInterfaceElement_*,_std::allocator<TPZInterfaceElement_*>_>
                            )._M_impl._M_node._M_size;
                  *psVar1 = *psVar1 + 1;
                  iVar9 = 9;
                  bVar3 = false;
                }
              }
              if (bVar3) goto LAB_013bf07d;
            }
          } while (iVar9 == 0);
          if ((local_f0.fGeoEl == local_b8.fGeoEl) && (local_f0.fSide == local_b8.fSide)) {
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMeshControl.cpp"
                       ,0x8b9);
          }
          p_Var8 = *(_Base_ptr *)p_Var8;
        } while (p_Var8 != local_a0);
      }
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(local_d8);
    } while ((_Rb_tree_header *)p_Var7 != &local_60._M_impl.super__Rb_tree_header);
  }
  std::
  _Rb_tree<long,_std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>,_std::_Select1st<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void TPZMHMeshControl::ConnectedInterfaceElements(int64_t skeleton, std::pair<int64_t,int64_t> &leftright, std::map<int64_t, std::list<TPZInterfaceElement *> > &intfaces)
{
    std::map<int64_t, std::list<TPZCompElSide> > ellist;
    ConnectedElements(skeleton, leftright, ellist);
    // neighbour to each element there is an interface element
    for (std::map<int64_t, std::list<TPZCompElSide> >::iterator it = ellist.begin(); it != ellist.end(); it++) {
        std::list<TPZCompElSide> &loclist = it->second;
        for (std::list<TPZCompElSide>::iterator it2 = loclist.begin(); it2 != loclist.end(); it2++) {
            TPZCompElSide celside = *it2;
            TPZGeoElSide gelside = celside.Reference();
            TPZGeoElSide neighbour = gelside.Neighbour();
            while (neighbour != gelside) {
                TPZCompElSide celneigh = neighbour.Reference();
                if (celneigh) {
                    TPZInterfaceElement *intface = dynamic_cast<TPZInterfaceElement *>(celneigh.Element());
                    if (intface && (intface->LeftElementSide() == celside || intface->RightElementSide() == celside)) {
                        intfaces[it->first].push_back(intface);
                        break;
                    }
                }
                neighbour = neighbour.Neighbour();
            }
            if (neighbour == gelside) {
                DebugStop();
            }
        }
    }
}